

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeTableMoveto(BtCursor *pCur,i64 intKey,int biasRight,int *pRes)

{
  u8 uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  ushort uVar7;
  MemPage *pMVar8;
  u8 *puVar9;
  u8 *puVar10;
  long lVar11;
  int iVar12;
  byte *pbVar13;
  u8 *p;
  int iVar14;
  int iVar15;
  u16 uVar16;
  long in_FS_OFFSET;
  i64 nCellKey;
  uint local_50;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((pCur->eState != '\0') || ((pCur->curFlags & 2) == 0)) goto LAB_0014fe9a;
  lVar11 = (pCur->info).nKey;
  if (lVar11 == intKey) {
    *pRes = 0;
  }
  else {
    if (lVar11 < intKey) {
      if ((pCur->curFlags & 8) == 0) {
        if (lVar11 + 1 == intKey) {
          *pRes = 0;
          iVar12 = sqlite3BtreeNext(pCur,(int)intKey);
          if (iVar12 != 0x65) {
            if (iVar12 != 0) goto LAB_001500e5;
            getCellInfo(pCur);
            iVar12 = 0;
            if ((pCur->info).nKey == intKey) goto LAB_001500e5;
          }
        }
        goto LAB_0014fe9a;
      }
    }
    else {
LAB_0014fe9a:
      iVar12 = moveToRoot(pCur);
      if (iVar12 != 0x10) {
        if (iVar12 == 0) {
LAB_0014fed1:
          pMVar8 = pCur->pPage;
          uVar6 = pMVar8->nCell;
          iVar15 = uVar6 - 1;
          iVar12 = iVar15 >> (1U - (char)biasRight & 0x1f);
          puVar9 = pMVar8->aDataOfst;
          uVar7 = pMVar8->maskPage;
          puVar10 = pMVar8->aCellIdx;
          uVar1 = pMVar8->intKeyLeaf;
          iVar14 = 0;
          do {
            local_40 = &DAT_aaaaaaaaaaaaaaaa;
            p = puVar9 + (CONCAT11(puVar10[(long)iVar12 * 2],puVar10[(long)iVar12 * 2 + 1]) & uVar7)
            ;
            if (uVar1 != '\0') {
              while ((char)*p < '\0') {
                p = p + 1;
                if (pMVar8->aDataEnd <= p) {
                  iVar12 = 0xb;
                  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12b36,
                              "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
                  goto LAB_001500e5;
                }
              }
              p = p + 1;
            }
            sqlite3GetVarint(p,(u64 *)&local_40);
            uVar16 = (u16)iVar12;
            if ((long)local_40 < intKey) {
              iVar14 = iVar12 + 1;
              if (iVar15 <= iVar12) goto LAB_0014ff9a;
            }
            else {
              if ((long)local_40 <= intKey) {
                pCur->ix = uVar16;
                if (pMVar8->leaf == '\0') goto LAB_0014ffd5;
                pCur->curFlags = pCur->curFlags | 2;
                (pCur->info).nKey = (i64)local_40;
                (pCur->info).nSize = 0;
                *pRes = 0;
                goto LAB_001500e2;
              }
              if (iVar12 <= iVar14) {
                iVar15 = 1;
                iVar12 = iVar14;
                goto LAB_0014ffc5;
              }
              iVar15 = iVar12 + -1;
            }
            iVar12 = iVar15 + iVar14 >> 1;
          } while( true );
        }
        goto LAB_001500e5;
      }
    }
    *pRes = -1;
  }
LAB_001500e2:
  iVar12 = 0;
LAB_001500e5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar12;
LAB_0014ff9a:
  iVar15 = -1;
  iVar12 = iVar14;
LAB_0014ffc5:
  if (pMVar8->leaf != '\0') {
    pCur->ix = uVar16;
    *pRes = iVar15;
    iVar12 = 0;
    goto LAB_0015011b;
  }
LAB_0014ffd5:
  local_50 = (uint)uVar6;
  if (iVar12 < (int)local_50) {
    lVar11 = (ulong)(uVar7 & CONCAT11(puVar10[(long)iVar12 * 2],puVar10[(long)iVar12 * 2 + 1])) + 3;
  }
  else {
    lVar11 = (ulong)pMVar8->hdrOffset + 0xb;
  }
  pbVar13 = pMVar8->aData + lVar11;
  bVar2 = pbVar13[-3];
  bVar3 = pbVar13[-2];
  bVar4 = pbVar13[-1];
  bVar5 = *pbVar13;
  pCur->ix = (u16)iVar12;
  iVar12 = moveToChild(pCur,(uint)bVar5 |
                            (uint)bVar4 << 8 | (uint)bVar3 << 0x10 | (uint)bVar2 << 0x18);
  if (iVar12 != 0) goto LAB_0015011b;
  goto LAB_0014fed1;
LAB_0015011b:
  (pCur->info).nSize = 0;
  goto LAB_001500e5;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeTableMoveto(
  BtCursor *pCur,          /* The cursor to be moved */
  i64 intKey,              /* The table key */
  int biasRight,           /* If true, bias the search to the high end */
  int *pRes                /* Write search results here */
){
  int rc;

  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );
  assert( pRes );
  assert( pCur->pKeyInfo==0 );
  assert( pCur->eState!=CURSOR_VALID || pCur->curIntKey!=0 );

  /* If the cursor is already positioned at the point we are trying
  ** to move to, then just return without doing any work */
  if( pCur->eState==CURSOR_VALID && (pCur->curFlags & BTCF_ValidNKey)!=0 ){
    if( pCur->info.nKey==intKey ){
      *pRes = 0;
      return SQLITE_OK;
    }
    if( pCur->info.nKey<intKey ){
      if( (pCur->curFlags & BTCF_AtLast)!=0 ){
        assert( cursorIsAtLastEntry(pCur) || CORRUPT_DB );
        *pRes = -1;
        return SQLITE_OK;
      }
      /* If the requested key is one more than the previous key, then
      ** try to get there using sqlite3BtreeNext() rather than a full
      ** binary search.  This is an optimization only.  The correct answer
      ** is still obtained without this case, only a little more slowly. */
      if( pCur->info.nKey+1==intKey ){
        *pRes = 0;
        rc = sqlite3BtreeNext(pCur, 0);
        if( rc==SQLITE_OK ){
          getCellInfo(pCur);
          if( pCur->info.nKey==intKey ){
            return SQLITE_OK;
          }
        }else if( rc!=SQLITE_DONE ){
          return rc;
        }
      }
    }
  }

#ifdef SQLITE_DEBUG
  pCur->pBtree->nSeek++;   /* Performance measurement during testing */
#endif

  rc = moveToRoot(pCur);
  if( rc ){
    if( rc==SQLITE_EMPTY ){
      assert( pCur->pgnoRoot==0 || pCur->pPage->nCell==0 );
      *pRes = -1;
      return SQLITE_OK;
    }
    return rc;
  }
  assert( pCur->pPage );
  assert( pCur->pPage->isInit );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->pPage->nCell > 0 );
  assert( pCur->iPage==0 || pCur->apPage[0]->intKey==pCur->curIntKey );
  assert( pCur->curIntKey );

  for(;;){
    int lwr, upr, idx, c;
    Pgno chldPg;
    MemPage *pPage = pCur->pPage;
    u8 *pCell;                          /* Pointer to current cell in pPage */

    /* pPage->nCell must be greater than zero. If this is the root-page
    ** the cursor would have been INVALID above and this for(;;) loop
    ** not run. If this is not the root-page, then the moveToChild() routine
    ** would have already detected db corruption. Similarly, pPage must
    ** be the right kind (index or table) of b-tree page. Otherwise
    ** a moveToChild() or moveToRoot() call would have detected corruption.  */
    assert( pPage->nCell>0 );
    assert( pPage->intKey );
    lwr = 0;
    upr = pPage->nCell-1;
    assert( biasRight==0 || biasRight==1 );
    idx = upr>>(1-biasRight); /* idx = biasRight ? upr : (lwr+upr)/2; */
    for(;;){
      i64 nCellKey;
      pCell = findCellPastPtr(pPage, idx);
      if( pPage->intKeyLeaf ){
        while( 0x80 <= *(pCell++) ){
          if( pCell>=pPage->aDataEnd ){
            return SQLITE_CORRUPT_PAGE(pPage);
          }
        }
      }
      getVarint(pCell, (u64*)&nCellKey);
      if( nCellKey<intKey ){
        lwr = idx+1;
        if( lwr>upr ){ c = -1; break; }
      }else if( nCellKey>intKey ){
        upr = idx-1;
        if( lwr>upr ){ c = +1; break; }
      }else{
        assert( nCellKey==intKey );
        pCur->ix = (u16)idx;
        if( !pPage->leaf ){
          lwr = idx;
          goto moveto_table_next_layer;
        }else{
          pCur->curFlags |= BTCF_ValidNKey;
          pCur->info.nKey = nCellKey;
          pCur->info.nSize = 0;
          *pRes = 0;
          return SQLITE_OK;
        }
      }
      assert( lwr+upr>=0 );
      idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2; */
    }
    assert( lwr==upr+1 || !pPage->leaf );
    assert( pPage->isInit );
    if( pPage->leaf ){
      assert( pCur->ix<pCur->pPage->nCell );
      pCur->ix = (u16)idx;
      *pRes = c;
      rc = SQLITE_OK;
      goto moveto_table_finish;
    }
moveto_table_next_layer:
    if( lwr>=pPage->nCell ){
      chldPg = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    }else{
      chldPg = get4byte(findCell(pPage, lwr));
    }
    pCur->ix = (u16)lwr;
    rc = moveToChild(pCur, chldPg);
    if( rc ) break;
  }
moveto_table_finish:
  pCur->info.nSize = 0;
  assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
  return rc;
}